

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sudoku.cpp
# Opt level: O2

int __thiscall Sudoku::rekurzivniReseni(Sudoku *this)

{
  int iVar1;
  Sudoku novy;
  Sudoku local_1d4;
  
  memcpy(&local_1d4,this,0x1bc);
  iVar1 = rKrok(&local_1d4,0);
  if (iVar1 == 1) {
    memcpy(this,&local_1d4,0x1bc);
  }
  return iVar1;
}

Assistant:

int Sudoku::rekurzivniReseni()
{
  Sudoku novy(this); // okopirujeme si sudoku
  int vysledek = novy.rKrok(0); // zkusime na nem rekurzivni metodu
  if(vysledek == true)
  {
    s = novy.s;// v pripade uspechu z nej prebereme jeho stav
  }
  return vysledek;// vratime vysledek pokusu, at je jakykoliv
}